

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

int ncnn::eval_list_expression
              (string *expr,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blobs,
              vector<int,_std::allocator<int>_> *outlist)

{
  char cVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  size_type sVar7;
  long lVar8;
  int *piVar9;
  float *pfVar10;
  reference pvVar11;
  undefined8 uVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  ulong in_RDI;
  anon_union_4_2_947300a4_for_typed_value_1 aVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  int size;
  int nscanf;
  int nscani;
  float vf;
  int vi;
  int r_7;
  int b_3;
  int a_8;
  typed_value tb_2;
  typed_value ta_5;
  float r_6;
  float b_2;
  float a_7;
  typed_value tb_1;
  typed_value ta_4;
  float r_5;
  float a_6;
  typed_value ta_3;
  int r_4;
  float a_5;
  int a_4;
  typed_value ta_2;
  float r_3;
  float a_3;
  int r_2;
  int a_2;
  typed_value ta_1;
  float r_1;
  float b_1;
  float a_1;
  int r;
  int b;
  int a;
  typed_value tb;
  typed_value ta;
  int size_1;
  Mat *blob;
  size_t blob_index;
  string *t_1;
  int i_1;
  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
  exprstack;
  char ch;
  size_t i;
  string t;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  reference in_stack_fffffffffffffb00;
  anon_union_4_2_947300a4_for_typed_value_1 local_4c0;
  anon_union_4_2_947300a4_for_typed_value_1 local_4bc;
  anon_union_4_2_947300a4_for_typed_value_1 local_48c;
  int local_448;
  int local_440;
  anon_union_4_2_947300a4_for_typed_value_1 local_438;
  anon_union_4_2_947300a4_for_typed_value_1 local_408;
  anon_union_4_2_947300a4_for_typed_value_1 local_404;
  typed_value local_37c;
  typed_value local_374;
  int local_36c;
  int local_368;
  float local_364;
  int local_360;
  typed_value local_35c;
  uint local_354;
  anon_union_4_2_947300a4_for_typed_value_1 local_350;
  anon_union_4_2_947300a4_for_typed_value_1 local_34c;
  value_type local_348;
  value_type local_340;
  typed_value local_334;
  float local_32c;
  anon_union_4_2_947300a4_for_typed_value_1 local_328;
  anon_union_4_2_947300a4_for_typed_value_1 local_324;
  value_type local_320;
  value_type local_318;
  typed_value local_310;
  float local_308;
  anon_union_4_2_947300a4_for_typed_value_1 local_304;
  value_type local_300;
  typed_value local_2f4;
  int local_2ec;
  anon_union_4_2_947300a4_for_typed_value_1 local_2e8;
  typed_value local_2e4;
  anon_union_4_2_947300a4_for_typed_value_1 local_2dc;
  value_type local_2d8;
  typed_value local_2d0;
  float local_2c8;
  anon_union_4_2_947300a4_for_typed_value_1 local_2c4;
  typed_value local_2c0;
  anon_union_4_2_947300a4_for_typed_value_1 local_2b8;
  anon_union_4_2_947300a4_for_typed_value_1 local_2b4;
  value_type local_2b0;
  typed_value local_2a8;
  float local_2a0;
  anon_union_4_2_947300a4_for_typed_value_1 local_29c;
  anon_union_4_2_947300a4_for_typed_value_1 local_298;
  typed_value local_294;
  int local_28c;
  anon_union_4_2_947300a4_for_typed_value_1 local_288;
  anon_union_4_2_947300a4_for_typed_value_1 local_284;
  value_type local_280;
  value_type local_278;
  typed_value local_26c;
  int local_264;
  void *local_260;
  int *local_258;
  undefined8 local_250;
  undefined4 local_248;
  long *local_240;
  undefined4 local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  ulong local_220;
  void **local_218;
  undefined4 local_20c;
  ulong local_208;
  reference local_200;
  int local_1f4;
  char local_189;
  ulong local_188;
  string local_180 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  ulong local_138;
  int local_12c;
  const_reference local_128;
  void **local_120;
  void **local_118;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  int local_ec;
  void **local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  int local_9c;
  int local_98;
  int local_94;
  void **local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  void **local_60;
  void **local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  int local_20;
  undefined4 local_1c;
  void **local_18;
  void *local_10;
  
  local_140 = in_RSI;
  local_138 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f8fb2c);
  std::__cxx11::string::string(local_180);
  for (local_188 = 0; uVar6 = local_188, uVar4 = std::__cxx11::string::size(), uVar6 < uVar4;
      local_188 = local_188 + 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[](local_138);
    local_189 = *pcVar5;
    if (((local_189 == '(') || (local_189 == ')')) || (local_189 == ',')) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb00,
                    (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        std::__cxx11::string::clear();
      }
    }
    else {
      std::__cxx11::string::operator+=(local_180,local_189);
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb00,
                (value_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  }
  std::__cxx11::string::~string(local_180);
  std::stack<ncnn::typed_value,std::deque<ncnn::typed_value,std::allocator<ncnn::typed_value>>>::
  stack<std::deque<ncnn::typed_value,std::allocator<ncnn::typed_value>>,void>
            ((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
              *)in_stack_fffffffffffffaf0);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_160);
  local_1f4 = (int)sVar7;
LAB_01f8fcab:
  do {
    local_1f4 = local_1f4 + -1;
    if (local_1f4 < 0) {
      in_stack_fffffffffffffb00 =
           std::
           stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
           ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  *)0x1f924e4);
      iVar3 = typed_value::to_int(in_stack_fffffffffffffb00);
      std::
      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>::
      pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
           *)0x1f92513);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,
                 (value_type_conflict *)CONCAT44(iVar3,in_stack_fffffffffffffaf8));
      while( true ) {
        bVar2 = std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::empty((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                         *)0x1f9253b);
        in_stack_fffffffffffffaf8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffaf8);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        pvVar11 = std::
                  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                         *)0x1f9255a);
        typed_value::to_int(pvVar11);
        std::
        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
        ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
               *)0x1f92589);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,
                   (value_type_conflict *)CONCAT44(iVar3,in_stack_fffffffffffffaf8));
      }
      local_12c = 0;
LAB_01f925ba:
      local_20c = 1;
      std::
      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>::
      ~stack((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
              *)0x1f925c7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb00);
      return local_12c;
    }
    local_200 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_160,(long)local_1f4);
    lVar8 = std::__cxx11::string::size();
    if ((((lVar8 == 2) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), '/' < *pcVar5)) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), *pcVar5 < ':')) &&
       (((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), *pcVar5 == 'w' ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), *pcVar5 == 'h')) ||
        ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), *pcVar5 == 'd' ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200), *pcVar5 == 'c'))))))
    {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
      cVar1 = *pcVar5;
      local_208 = (long)(cVar1 + -0x30);
      sVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_140);
      if (sVar7 <= (ulong)(long)(cVar1 + -0x30)) {
        fprintf(_stderr,"shape expression blob index %d out of bound!",local_208 & 0xffffffff);
        fprintf(_stderr,"\n");
        local_12c = -1;
        goto LAB_01f925ba;
      }
      local_128 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_140,local_208);
      local_120 = &local_260;
      if (local_128->dims == 1) {
        local_ec = local_128->w * local_128->elempack;
        local_e8 = &local_260;
        local_f8 = 0;
        local_100 = 4;
        local_108 = 0;
        local_250 = 4;
        local_248 = 1;
        local_238 = 1;
        local_230 = 1;
        local_22c = 1;
        local_228 = 1;
        local_220 = (ulong)local_ec;
        local_234 = local_ec;
      }
      else if (local_128->dims == 2) {
        local_c4 = local_128->w;
        local_c8 = local_128->h * local_128->elempack;
        local_c0 = &local_260;
        local_d0 = 0;
        local_d8 = 4;
        local_e0 = 0;
        local_250 = 4;
        local_248 = 1;
        local_238 = 2;
        local_22c = 1;
        local_228 = 1;
        local_220 = (long)local_c4 * (long)local_c8;
        local_234 = local_c4;
        local_230 = local_c8;
      }
      else if (local_128->dims == 3) {
        local_94 = local_128->w;
        local_98 = local_128->h;
        local_9c = local_128->c * local_128->elempack;
        local_90 = &local_260;
        local_a8 = 0;
        local_b0 = 4;
        local_b8 = 0;
        local_250 = 4;
        local_248 = 1;
        local_238 = 3;
        local_22c = 1;
        local_38 = (long)local_94 * (long)local_98 * 4;
        local_3c = 0x10;
        local_220 = (local_38 + 0xfU & 0xfffffffffffffff0) / 4;
        local_234 = local_94;
        local_230 = local_98;
        local_228 = local_9c;
      }
      else if (local_128->dims == 4) {
        local_64 = local_128->w;
        local_68 = local_128->h;
        local_6c = local_128->d;
        local_70 = local_128->c * local_128->elempack;
        local_60 = &local_260;
        local_78 = 0;
        local_80 = 4;
        local_88 = 0;
        local_250 = 4;
        local_248 = 1;
        local_238 = 4;
        local_48 = (long)local_64 * (long)local_68 * (long)local_6c * 4;
        local_4c = 0x10;
        local_220 = (local_48 + 0xfU & 0xfffffffffffffff0) / 4;
        local_234 = local_64;
        local_230 = local_68;
        local_22c = local_6c;
        local_228 = local_70;
      }
      else {
        local_58 = &local_260;
        local_250 = 0;
        local_248 = 0;
        local_238 = 0;
        local_234 = 0;
        local_230 = 0;
        local_22c = 0;
        local_228 = 0;
        local_220 = 0;
      }
      local_240 = (long *)0x0;
      local_258 = (int *)0x0;
      local_260 = (void *)0x0;
      local_218 = &local_260;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
      if (*pcVar5 == 'w') {
        local_264 = *(int *)((long)local_218 + 0x2c);
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
        if (*pcVar5 == 'h') {
          local_264 = *(int *)(local_218 + 6);
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_200);
          if (*pcVar5 == 'd') {
            local_264 = *(int *)((long)local_218 + 0x34);
          }
          else {
            local_264 = *(int *)(local_218 + 7);
          }
        }
      }
      typed_value::typed_value(&local_26c,local_264);
      std::
      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>::
      push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
            *)in_stack_fffffffffffffaf0,
           (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_118 = &local_260;
      local_18 = local_118;
      if (local_258 != (int *)0x0) {
        local_1c = 0xffffffff;
        LOCK();
        local_20 = *local_258;
        *local_258 = *local_258 + -1;
        UNLOCK();
        if (local_20 == 1) {
          if (local_240 == (long *)0x0) {
            local_10 = local_260;
            if (local_260 != (void *)0x0) {
              free(local_260);
            }
          }
          else {
            (**(code **)(*local_240 + 0x18))(local_240,local_260);
          }
        }
      }
      local_260 = (void *)0x0;
      local_250 = 0;
      local_248 = 0;
      local_238 = 0;
      local_234 = 0;
      local_230 = 0;
      local_22c = 0;
      local_228 = 0;
      local_220 = 0;
      local_258 = (int *)0x0;
      goto LAB_01f8fcab;
    }
    bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                            (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    if (((bVar2) ||
        (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                 (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8)), bVar2)) ||
       ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                 (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8)), bVar2 ||
        (((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                    in_stack_fffffffffffffae8)), bVar2 ||
          (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                    in_stack_fffffffffffffae8)), bVar2)) ||
         (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8)), bVar2)))))) {
      pvVar11 = std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                       *)0x1f907bd);
      local_278 = *pvVar11;
      std::
      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>::
      pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
           *)0x1f907e7);
      pvVar11 = std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                       *)0x1f907f6);
      local_280 = *pvVar11;
      std::
      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>::
      pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
           *)0x1f90820);
      if ((local_278.type == 0) && (local_280.type == 0)) {
        local_284.i = local_278.field_1.i;
        local_288.i = local_280.field_1.i;
        local_28c = 0;
        bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8
                                                ));
        if (bVar2) {
          local_28c = local_284.i + local_288.i;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
          if (bVar2) {
            local_28c = local_284.i - local_288.i;
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (bVar2) {
              local_28c = local_284.i * local_288.i;
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                if (local_288.i == 0) {
                  fprintf(_stderr,"expr divide by zero");
                  fprintf(_stderr,"\n");
                  local_12c = -1;
                  goto LAB_01f925ba;
                }
                local_28c = local_284.i / local_288.i;
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  piVar9 = std::max<int>(&local_284.i,&local_288.i);
                  local_28c = *piVar9;
                }
                else {
                  piVar9 = std::min<int>(&local_284.i,&local_288.i);
                  local_28c = *piVar9;
                }
              }
            }
          }
        }
        typed_value::typed_value(&local_294,local_28c);
        std::
        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
        ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                *)in_stack_fffffffffffffaf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      }
      else {
        if (local_278.type == 0) {
          local_404.f = (float)local_278.field_1.i;
        }
        else {
          local_404.i = local_278.field_1.i;
        }
        local_298.i = local_404.i;
        if (local_280.type == 0) {
          local_408.f = (float)local_280.field_1.i;
        }
        else {
          local_408.i = local_280.field_1.i;
        }
        local_29c.i = local_408.i;
        local_2a0 = 0.0;
        bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8
                                                ));
        if (bVar2) {
          local_2a0 = local_298.f + local_29c.f;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
          if (bVar2) {
            local_2a0 = local_298.f - local_29c.f;
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (bVar2) {
              local_2a0 = local_298.f * local_29c.f;
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                local_2a0 = floorf(local_298.f / local_29c.f);
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  pfVar10 = std::max<float>(&local_298.f,&local_29c.f);
                  local_2a0 = *pfVar10;
                }
                else {
                  pfVar10 = std::min<float>(&local_298.f,&local_29c.f);
                  local_2a0 = *pfVar10;
                }
              }
            }
          }
        }
        typed_value::typed_value(&local_2a8,local_2a0);
        std::
        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
        ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                *)in_stack_fffffffffffffaf0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      }
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                              (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
      ;
      if (((bVar2) ||
          (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                    in_stack_fffffffffffffae8)), bVar2)) ||
         ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                    in_stack_fffffffffffffae8)), bVar2 ||
          (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                    in_stack_fffffffffffffae8)), bVar2)))) {
        pvVar11 = std::
                  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                         *)0x1f90de0);
        local_2b0 = *pvVar11;
        std::
        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
        ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
               *)0x1f90e0a);
        if (local_2b0.type == 0) {
          local_2b4.i = local_2b0.field_1.i;
          local_2b8 = (anon_union_4_2_947300a4_for_typed_value_1)0x0;
          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
          if (bVar2) {
            if (local_2b4.i < 1) {
              local_438.i = -local_2b4.i;
            }
            else {
              local_438.i = local_2b4.i;
            }
            local_2b8.i = local_438.i;
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (bVar2) {
              local_2b8.i = -local_2b4.i;
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                if (local_2b4.i < 1) {
                  local_440 = -1;
                  if (local_2b4.i == 0) {
                    local_440 = 0;
                  }
                }
                else {
                  local_440 = 1;
                }
                local_2b8.i = local_440;
              }
              else {
                local_2b8.i = local_2b4.i * local_2b4.i;
              }
            }
          }
          typed_value::typed_value(&local_2c0,local_2b8.i);
          std::
          stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
          ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  *)in_stack_fffffffffffffaf0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
        else {
          local_2c4.i = local_2b0.field_1.i;
          local_2c8 = 0.0;
          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
          if (bVar2) {
            local_2c8 = ABS(local_2c4.f);
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (bVar2) {
              local_2c8 = -local_2c4.f;
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                if (local_2c4.f <= 0.0) {
                  local_448 = -1;
                  if (local_2c4.f == 0.0) {
                    local_448 = 0;
                  }
                }
                else {
                  local_448 = 1;
                }
                local_2c8 = (float)local_448;
              }
              else {
                local_2c8 = local_2c4.f * local_2c4.f;
              }
            }
          }
          typed_value::typed_value(&local_2d0,local_2c8);
          std::
          stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
          ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  *)in_stack_fffffffffffffaf0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        }
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                (char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8
                                                ));
        if ((((bVar2) ||
             (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8)), bVar2)) ||
            (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                     (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                      in_stack_fffffffffffffae8)), bVar2)) ||
           (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8)), bVar2)) {
          pvVar11 = std::
                    stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                    ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                           *)0x1f911e3);
          local_2d8 = *pvVar11;
          std::
          stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
          ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                 *)0x1f9120d);
          if (local_2d8.type == 0) {
            local_2dc.i = local_2d8.field_1.i;
            typed_value::typed_value(&local_2e4,local_2d8.field_1.i);
            std::
            stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
            ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                    *)in_stack_fffffffffffffaf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          }
          else {
            local_2e8.i = local_2d8.field_1.i;
            local_2ec = 0;
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            aVar13 = local_2e8;
            if (!bVar2) {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                dVar16 = std::ceil((double)(ulong)(uint)local_2e8.i);
                aVar13.i = SUB84(dVar16,0);
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  dVar16 = std::floor((double)(ulong)(uint)local_2e8.i);
                  aVar13.i = SUB84(dVar16,0);
                }
                else {
                  dVar16 = std::round((double)(ulong)(uint)local_2e8.i);
                  aVar13.i = SUB84(dVar16,0);
                }
              }
            }
            local_2ec = (int)aVar13.f;
            typed_value::typed_value(&local_2f4,local_2ec);
            std::
            stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
            ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                    *)in_stack_fffffffffffffaf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          }
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                   in_stack_fffffffffffffae8));
          if ((((bVar2) ||
               (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8)), bVar2)) ||
              (((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                         (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                          in_stack_fffffffffffffae8)), bVar2 ||
                ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8)), bVar2 ||
                 (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8)), bVar2)))) ||
               (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8)), bVar2)))) ||
             (((((((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2 ||
                   (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2)) ||
                  (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2)) ||
                 (((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2 ||
                   (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2)) ||
                  ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2 ||
                   ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                             (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                              in_stack_fffffffffffffae8)), bVar2 ||
                    (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                             (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                              in_stack_fffffffffffffae8)), bVar2))))
                  )))) || (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                   (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                    in_stack_fffffffffffffae8)),
                          bVar2)) ||
               (((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8)), bVar2 ||
                 (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8)), bVar2)) ||
                (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                         (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                          in_stack_fffffffffffffae8)), bVar2)))) ||
              (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                       (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                        in_stack_fffffffffffffae8)), bVar2)))) {
            pvVar11 = std::
                      stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                      ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                             *)0x1f9173d);
            local_300 = *pvVar11;
            std::
            stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
            ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                   *)0x1f91767);
            if (local_300.type == 0) {
              local_48c.f = (float)local_300.field_1.i;
            }
            else {
              local_48c.i = local_300.field_1.i;
            }
            local_304.i = local_48c.i;
            local_308 = 0.0;
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (bVar2) {
              local_308 = acosf(local_304.f);
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                local_308 = acoshf(local_304.f);
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  local_308 = asinf(local_304.f);
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8));
                  if (bVar2) {
                    local_308 = asinhf(local_304.f);
                  }
                  else {
                    bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8));
                    if (bVar2) {
                      local_308 = atanf(local_304.f);
                    }
                    else {
                      bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                              (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                               in_stack_fffffffffffffae8));
                      if (bVar2) {
                        local_308 = atanhf(local_304.f);
                      }
                      else {
                        bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                 in_stack_fffffffffffffae8));
                        if (bVar2) {
                          local_308 = cosf(local_304.f);
                        }
                        else {
                          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                   in_stack_fffffffffffffae8));
                          if (bVar2) {
                            local_308 = coshf(local_304.f);
                          }
                          else {
                            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                     in_stack_fffffffffffffae8));
                            if (bVar2) {
                              local_308 = erff(local_304.f);
                            }
                            else {
                              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                       in_stack_fffffffffffffae8));
                              if (bVar2) {
                                local_308 = expf(local_304.f);
                              }
                              else {
                                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                                         in_stack_fffffffffffffae8))
                                ;
                                if (bVar2) {
                                  local_308 = logf(local_304.f);
                                }
                                else {
                                  bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                          (char *)CONCAT44(in_stack_fffffffffffffaec
                                                                           ,
                                                  in_stack_fffffffffffffae8));
                                  if (bVar2) {
                                    local_308 = log10f(local_304.f);
                                  }
                                  else {
                                    bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                            (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                    if (bVar2) {
                                      local_308 = 1.0 / local_304.f;
                                    }
                                    else {
                                      bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                              (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                      if (bVar2) {
                                        local_308 = 1.0 / SQRT(local_304.f);
                                      }
                                      else {
                                        bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                                (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                        if (bVar2) {
                                          local_308 = sinf(local_304.f);
                                        }
                                        else {
                                          bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                          if (bVar2) {
                                            local_308 = sinhf(local_304.f);
                                          }
                                          else {
                                            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                                    (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                            if (bVar2) {
                                              local_308 = SQRT(local_304.f);
                                            }
                                            else {
                                              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                                                      (char *)CONCAT44(
                                                  in_stack_fffffffffffffaec,
                                                  in_stack_fffffffffffffae8));
                                              if (bVar2) {
                                                local_308 = tanf(local_304.f);
                                              }
                                              else {
                                                local_308 = tanhf(local_304.f);
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            typed_value::typed_value(&local_310,local_308);
            std::
            stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
            ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                    *)in_stack_fffffffffffffaf0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                    (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                     in_stack_fffffffffffffae8));
            if (((bVar2) ||
                (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                         (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                          in_stack_fffffffffffffae8)), bVar2)) ||
               (((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8)), bVar2 ||
                 ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2 ||
                  (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2))))
                || (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2))))
            {
              pvVar11 = std::
                        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                        ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                               *)0x1f91de2);
              local_318 = *pvVar11;
              std::
              stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
              ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                     *)0x1f91e06);
              pvVar11 = std::
                        stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                        ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                               *)0x1f91e15);
              local_320 = *pvVar11;
              std::
              stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
              ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                     *)0x1f91e39);
              if (local_318.type == 0) {
                local_4bc.f = (float)local_318.field_1.i;
              }
              else {
                local_4bc.i = local_318.field_1.i;
              }
              local_324.i = local_4bc.i;
              if (local_320.type == 0) {
                local_4c0.f = (float)local_320.field_1.i;
              }
              else {
                local_4c0.i = local_320.field_1.i;
              }
              local_328.i = local_4c0.i;
              local_32c = 0.0;
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if (bVar2) {
                local_32c = local_324.f / local_328.f;
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  local_32c = atan2f(local_324.f,local_328.f);
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8));
                  if (bVar2) {
                    local_32c = fmodf(local_324.f,local_328.f);
                  }
                  else {
                    bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8));
                    if (bVar2) {
                      local_32c = powf(local_324.f,local_328.f);
                    }
                    else {
                      bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                              (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                               in_stack_fffffffffffffae8));
                      if (bVar2) {
                        local_32c = fmodf(local_324.f,local_328.f);
                        if (local_324.f * local_328.f < 0.0) {
                          local_32c = local_328.f + local_32c;
                        }
                      }
                      else {
                        fVar14 = expf(local_324.f);
                        fVar15 = expf(local_328.f);
                        local_32c = logf(fVar14 + fVar15);
                      }
                    }
                  }
                }
              }
              typed_value::typed_value(&local_334,local_32c);
              std::
              stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
              ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                      *)in_stack_fffffffffffffaf0,
                     (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                      (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8));
              if ((((bVar2) ||
                   (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8)), bVar2)) ||
                  (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2)) ||
                 ((bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2 ||
                  (bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                           (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                            in_stack_fffffffffffffae8)), bVar2)))) {
                pvVar11 = std::
                          stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                          ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                                 *)0x1f92193);
                local_340 = *pvVar11;
                std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                       *)0x1f921b7);
                pvVar11 = std::
                          stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                          ::top((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                                 *)0x1f921c6);
                local_348 = *pvVar11;
                std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::pop((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                       *)0x1f921ea);
                local_34c.i = local_340.field_1.i;
                local_350.i = local_348.field_1.i;
                local_354 = 0;
                bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                        (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8));
                if (bVar2) {
                  local_354 = local_34c.i & local_350.i;
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                          (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                           in_stack_fffffffffffffae8));
                  if (bVar2) {
                    local_354 = local_34c.i | local_350.i;
                  }
                  else {
                    bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                            (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                             in_stack_fffffffffffffae8));
                    if (bVar2) {
                      local_354 = local_34c.i ^ local_350.i;
                    }
                    else {
                      bVar2 = std::operator==(in_stack_fffffffffffffaf0,
                                              (char *)CONCAT44(in_stack_fffffffffffffaec,
                                                               in_stack_fffffffffffffae8));
                      if (bVar2) {
                        local_354 = local_34c.i << ((byte)local_350.i & 0x1f);
                      }
                      else {
                        local_354 = local_34c.i >> ((byte)local_350.i & 0x1f);
                      }
                    }
                  }
                }
                typed_value::typed_value(&local_35c,local_354);
                std::
                stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                        *)in_stack_fffffffffffffaf0,
                       (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              }
              else {
                uVar12 = std::__cxx11::string::c_str();
                local_368 = __isoc99_sscanf(uVar12,"%d",&local_360);
                uVar12 = std::__cxx11::string::c_str();
                local_36c = __isoc99_sscanf(uVar12,"%f",&local_364);
                __stream = _stderr;
                if (((local_368 != 1) || (local_36c != 1)) ||
                   (((float)local_360 != local_364 || (NAN((float)local_360) || NAN(local_364))))) {
                  if (local_36c != 1) {
                    uVar12 = std::__cxx11::string::c_str();
                    fprintf(__stream,"malformed literal token %s",uVar12);
                    fprintf(_stderr,"\n");
                    local_12c = -1;
                    goto LAB_01f925ba;
                  }
                  typed_value::typed_value(&local_37c,local_364);
                  std::
                  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
                }
                else {
                  typed_value::typed_value(&local_374,local_360);
                  std::
                  stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                  ::push((stack<ncnn::typed_value,_std::deque<ncnn::typed_value,_std::allocator<ncnn::typed_value>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (value_type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                        );
                }
              }
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

int eval_list_expression(const std::string& expr, const std::vector<Mat>& blobs, std::vector<int>& outlist)
{
    // /(0w,2),*(0h,2),0c

    // split by , ( )
    //
    //     /
    //         0w
    //         2
    // -------------------
    //     *
    //         0h
    //         2
    // -------------------
    //     0c
    // -------------------

    // split by , ( )

    // split into tokens
    std::vector<std::string> tokens;
    {
        std::string t;
        for (size_t i = 0; i < expr.size(); i++)
        {
            char ch = expr[i];

            if (ch == '(' || ch == ')' || ch == ',')
            {
                if (!t.empty())
                {
                    tokens.push_back(t);
                    t.clear();
                }
            }
            else
            {
#if NCNN_SIMPLESTL
                t.resize(t.size() + 1);
                t[t.size() - 1] = ch;
#else
                t += ch;
#endif
            }
        }

        if (!t.empty())
        {
            tokens.push_back(t);
        }
    }

    //      / 0w 2 * 0h 2 0c

    // scan and stack
    std::stack<typed_value> exprstack;
    for (int i = (int)tokens.size() - 1; i >= 0; i--)
    {
        const std::string& t = tokens[i];

        // NCNN_LOGE("t = %s", t.c_str());

        // + - * / 0w 0h 0d 0c 12345

        if (t.size() == 2 && (t[0] >= '0' && t[0] <= '9') && (t[1] == 'w' || t[1] == 'h' || t[1] == 'd' || t[1] == 'c'))
        {
            size_t blob_index = t[0] - '0';
            if (blob_index >= blobs.size())
            {
                NCNN_LOGE("shape expression blob index %d out of bound!", (int)blob_index);
                return -1;
            }

            const Mat& blob = blobs[blob_index].shape();
            int size;
            if (t[1] == 'w')
                size = blob.w;
            else if (t[1] == 'h')
                size = blob.h;
            else if (t[1] == 'd')
                size = blob.d;
            else // if (t[1] == 'c')
                size = blob.c;

            // NCNN_LOGE("t = %s  =>  %d", t.c_str(), size);

            exprstack.push(size);
        }
        else if (t == "+" || t == "-" || t == "*" || t == "//" || t == "max" || t == "min")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            if (ta.type == 0 && tb.type == 0)
            {
                const int a = ta.i;
                const int b = tb.i;

                int r = 0;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    if (b == 0)
                    {
                        NCNN_LOGE("expr divide by zero");
                        return -1;
                    }
                    else
                    {
                        r = a / b;
                    }
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.type == 0 ? ta.i : ta.f;
                const float b = tb.type == 0 ? tb.i : tb.f;

                float r = 0.f;
                if (t == "+")
                {
                    r = a + b;
                }
                else if (t == "-")
                {
                    r = a - b;
                }
                else if (t == "*")
                {
                    r = a * b;
                }
                else if (t == "//")
                {
                    r = floorf(a / b);
                }
                else if (t == "max")
                {
                    r = std::max(a, b);
                }
                else // if (t == "min")
                {
                    r = std::min(a, b);
                }
                exprstack.push(r);
            }
        }
        else if (t == "abs" || t == "neg" || t == "sign" || t == "square")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;

                int r = 0;
                if (t == "abs")
                {
                    r = a > 0 ? a : -a;
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0 ? 1 : (a == 0 ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
            else
            {
                const float a = ta.f;

                float r = 0;
                if (t == "abs")
                {
                    r = fabsf(a);
                }
                else if (t == "neg")
                {
                    r = -a;
                }
                else if (t == "sign")
                {
                    r = a > 0.f ? 1 : (a == 0.f ? 0 : -1);
                }
                else // if (t == "square")
                {
                    r = a * a;
                }
                exprstack.push(r);
            }
        }
        else if (t == "trunc" || t == "ceil" || t == "floor" || t == "round")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            if (ta.type == 0)
            {
                const int a = ta.i;
                exprstack.push(a);
            }
            else
            {
                const float a = ta.f;

                int r = 0;
                if (t == "trunc")
                {
                    r = (int)a;
                }
                else if (t == "ceil")
                {
                    r = (int)ceil(a);
                }
                else if (t == "floor")
                {
                    r = (int)floor(a);
                }
                else // if (t == "round")
                {
                    r = (int)round(a);
                }
                exprstack.push(r);
            }
        }
        else if (t == "acos"
                 || t == "acosh"
                 || t == "asin"
                 || t == "asinh"
                 || t == "atan"
                 || t == "atanh"
                 || t == "cos"
                 || t == "cosh"
                 || t == "erf"
                 || t == "exp"
                 || t == "log"
                 || t == "log10"
                 || t == "reciprocal"
                 || t == "rsqrt"
                 || t == "sin"
                 || t == "sinh"
                 || t == "sqrt"
                 || t == "tan"
                 || t == "tanh")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;

            float r = 0;
            if (t == "acos")
            {
                r = acosf(a);
            }
            else if (t == "acosh")
            {
                r = acoshf(a);
            }
            else if (t == "asin")
            {
                r = asinf(a);
            }
            else if (t == "asinh")
            {
                r = asinhf(a);
            }
            else if (t == "atan")
            {
                r = atanf(a);
            }
            else if (t == "atanh")
            {
                r = atanhf(a);
            }
            else if (t == "cos")
            {
                r = cosf(a);
            }
            else if (t == "cosh")
            {
                r = coshf(a);
            }
            else if (t == "erf")
            {
                r = erff(a);
            }
            else if (t == "exp")
            {
                r = expf(a);
            }
            else if (t == "log")
            {
                r = logf(a);
            }
            else if (t == "log10")
            {
                r = log10f(a);
            }
            else if (t == "reciprocal")
            {
                r = 1.f / a;
            }
            else if (t == "rsqrt")
            {
                r = 1.f / sqrtf(a);
            }
            else if (t == "sin")
            {
                r = sinf(a);
            }
            else if (t == "sinh")
            {
                r = sinhf(a);
            }
            else if (t == "sqrt")
            {
                r = sqrtf(a);
            }
            else if (t == "tan")
            {
                r = tanf(a);
            }
            else // if (t == "tanh")
            {
                r = tanhf(a);
            }
            exprstack.push(r);
        }
        else if (t == "/"
                 || t == "atan2"
                 || t == "fmod"
                 || t == "pow"
                 || t == "remainder"
                 || t == "logaddexp")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            const float a = ta.type == 0 ? ta.i : ta.f;
            const float b = tb.type == 0 ? tb.i : tb.f;

            float r = 0.f;
            if (t == "/")
            {
                r = a / b;
            }
            else if (t == "atan2")
            {
                r = atan2f(a, b);
            }
            else if (t == "fmod")
            {
                r = fmodf(a, b);
            }
            else if (t == "pow")
            {
                r = powf(a, b);
            }
            else if (t == "remainder")
            {
                r = fmodf(a, b);
                if (a * b < 0)
                    r += b;
            }
            else // if (t == "logaddexp")
            {
                r = logf(expf(a) + expf(b));
            }
            exprstack.push(r);
        }
        else if (t == "and" || t == "or" || t == "xor" || t == "lshift" || t == "rshift")
        {
            typed_value ta = exprstack.top();
            exprstack.pop();
            typed_value tb = exprstack.top();
            exprstack.pop();

            // assert ta.type == 0 && tb.type == 0

            const int a = ta.i;
            const int b = tb.i;

            int r = 0;
            if (t == "and")
            {
                r = a & b;
            }
            else if (t == "or")
            {
                r = a | b;
            }
            else if (t == "xor")
            {
                r = a ^ b;
            }
            else if (t == "lshift")
            {
                r = a << b;
            }
            else // if (t == "rshift")
            {
                r = a >> b;
            }
            exprstack.push(r);
        }
        else
        {
            // literal
            int vi;
            float vf;
            int nscani = sscanf(t.c_str(), "%d", &vi);
            int nscanf = sscanf(t.c_str(), "%f", &vf);
            if (nscani == 1 && nscanf == 1 && vi == vf)
            {
                exprstack.push(vi);
            }
            else if (nscanf == 1)
            {
                exprstack.push(vf);
            }
            else
            {
                NCNN_LOGE("malformed literal token %s", t.c_str());
                return -1;
            }
        }
    }

    int size = exprstack.top().to_int();
    exprstack.pop();
    outlist.push_back(size);
    while (!exprstack.empty())
    {
        size = exprstack.top().to_int();
        exprstack.pop();
        outlist.push_back(size);
    }

    // NCNN_LOGE("shape %s = %d %d", expr.c_str(), list[0], list[1]);

    return 0;
}